

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding_test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5a800::FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test::
TestBody(FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Message local_30;
  AssertHelper local_28;
  AssertionResult local_20;
  
  local_30.ss_.ptr_._0_1_ = 0x30;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x30);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::NOOP",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x31;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x31);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED1",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x32;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x32);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED2",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x33;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x33);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED3",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x34;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x34);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED4",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x38;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x38);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED8",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ss_.ptr_._0_1_ = 0x40;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x40);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&local_20,"FieldEncodingEnum::FIXED16",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16)",
             (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
  if (local_20.success_ == false) {
    testing::Message::Message(&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
  }
  else {
    testing::AssertionResult::~AssertionResult(&local_20);
    local_30.ss_.ptr_._0_1_ = 0x42;
    local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x42);
    testing::internal::
    CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
              ((internal *)&local_20,"FieldEncodingEnum::BYTE_ARRAY",
               "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY)",
               (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
    if (local_20.success_ == false) {
      testing::Message::Message(&local_30);
      if (local_20.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                 ,0x22,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,&local_30);
    }
    else {
      testing::AssertionResult::~AssertionResult(&local_20);
      local_30.ss_.ptr_._0_1_ = 0x53;
      local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x53);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                ((internal *)&local_20,"FieldEncodingEnum::VARINT_STRING",
                 "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING)",
                 (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
      if (local_20.success_ == false) {
        testing::Message::Message(&local_30);
        if (local_20.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                   ,0x23,pcVar3);
        testing::internal::AssertHelper::operator=(&local_28,&local_30);
      }
      else {
        testing::AssertionResult::~AssertionResult(&local_20);
        local_30.ss_.ptr_._0_1_ = 0x56;
        local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x56);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                  ((internal *)&local_20,"FieldEncodingEnum::VARINT",
                   "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT)",
                   (FieldEncodingEnum *)&local_30,(FieldEncodingEnum *)&local_28);
        if (local_20.success_ != false) goto LAB_00170fff;
        testing::Message::Message(&local_30);
        if (local_20.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                   ,0x24,pcVar3);
        testing::internal::AssertHelper::operator=(&local_28,&local_30);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::Message::~Message(&local_30);
LAB_00170fff:
  testing::AssertionResult::~AssertionResult(&local_20);
  return;
}

Assistant:

TEST(FieldEncodingTest, TestValueOfCodeReturnsSameFieldEncodingType)
{
    ASSERT_EQ(FieldEncodingEnum::NOOP, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP));
    ASSERT_EQ(FieldEncodingEnum::FIXED1, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1));
    ASSERT_EQ(FieldEncodingEnum::FIXED2, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2));
    ASSERT_EQ(FieldEncodingEnum::FIXED3, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3));
    ASSERT_EQ(FieldEncodingEnum::FIXED4, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4));
    ASSERT_EQ(FieldEncodingEnum::FIXED8, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8));
    ASSERT_EQ(FieldEncodingEnum::FIXED16, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16));
    ASSERT_EQ(FieldEncodingEnum::BYTE_ARRAY, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY));
    ASSERT_EQ(FieldEncodingEnum::VARINT_STRING, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING));
    ASSERT_EQ(FieldEncodingEnum::VARINT, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT));
}